

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall
Js::ScriptContext::AddToEvalMap
          (ScriptContext *this,FastEvalMapString *key,BOOL isIndirect,ScriptFunction *pfuncScript)

{
  Utf8SourceInfo *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionBody *pFVar4;
  
  if ((((pfuncScript->super_ScriptFunctionBase).super_JavascriptFunction.functionInfo.ptr)->
       attributes & Generator) != None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xb4e,"(!pfuncScript->GetFunctionInfo()->IsGenerator())",
                                "!pfuncScript->GetFunctionInfo()->IsGenerator()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pFVar4 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)pfuncScript);
  this_00 = (pFVar4->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
  bVar2 = IsScriptContextInDebugMode(this);
  if ((bVar2) && ((this_00->field_0xa8 & 4) == 0)) {
    bVar2 = Utf8SourceInfo::IsInDebugMode(this_00);
    if (!bVar2) {
      Throw::FatalInternalError(-0x7fffbffb);
    }
  }
  if (this->TTDRecordOrReplayModeEnabled != false) {
    return;
  }
  AddToEvalMapHelper(this,key,isIndirect,pfuncScript);
  return;
}

Assistant:

void ScriptContext::AddToEvalMap(FastEvalMapString & key, BOOL isIndirect, ScriptFunction *pfuncScript)
    {
        Assert(!pfuncScript->GetFunctionInfo()->IsGenerator());

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        Js::Utf8SourceInfo* utf8SourceInfo = pfuncScript->GetFunctionBody()->GetUtf8SourceInfo();
        if (this->IsScriptContextInDebugMode() && !utf8SourceInfo->GetIsLibraryCode() && !utf8SourceInfo->IsInDebugMode())
        {
            // Identifying if any non library function escaped for not being in debug mode.
            Throw::FatalInternalError();
        }
#endif

#if ENABLE_TTD
        if(!this->IsTTDRecordOrReplayModeEnabled())
        {
            this->AddToEvalMapHelper(key, isIndirect, pfuncScript);
        }
#else
        this->AddToEvalMapHelper(key, isIndirect, pfuncScript);
#endif
    }